

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::InternalIsFileLoaded(DescriptorPool *this,string *filename)

{
  FileDescriptor *pFVar1;
  MutexLockMaybe lock;
  MutexLockMaybe MStack_18;
  
  internal::MutexLockMaybe::MutexLockMaybe(&MStack_18,this->mutex_);
  pFVar1 = Tables::FindFile((this->tables_)._M_t.
                            super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            .
                            super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                            ._M_head_impl,filename);
  internal::MutexLockMaybe::~MutexLockMaybe(&MStack_18);
  return pFVar1 != (FileDescriptor *)0x0;
}

Assistant:

bool DescriptorPool::InternalIsFileLoaded(const std::string& filename) const {
  MutexLockMaybe lock(mutex_);
  return tables_->FindFile(filename) != nullptr;
}